

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFileEqnStorage.cpp
# Opt level: O2

void __thiscall
TPZFileEqnStorage<std::complex<long_double>_>::ReadBlockPositions
          (TPZFileEqnStorage<std::complex<long_double>_> *this)

{
  ostream *poVar1;
  size_t __n;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int64_t nextpos;
  
  TPZManVector<long,_10>::Resize
            (&(this->fBlockPos).super_TPZManVector<long,_10>,
             ((long)this->fNumHeaders + -1) * (long)this->fNumBlocks);
  std::operator<<((ostream *)&std::cout,"Reading Block Positions\n");
  std::ostream::flush();
  iVar3 = 0;
  iVar5 = 0;
  uVar2 = 0;
  iVar4 = 0;
  while( true ) {
    if (this->fNumBlocks <= (int)uVar2) break;
    std::operator<<((ostream *)&std::cout,"*");
    std::ostream::flush();
    if ((uVar2 / 0x14) * 0x14 + iVar5 == 0) {
      poVar1 = (ostream *)std::ostream::operator<<(&std::cout,iVar3 / this->fNumBlocks);
      std::operator<<(poVar1,"% Read\n");
      std::ostream::flush();
    }
    fread((this->fBlockPos).super_TPZManVector<long,_10>.super_TPZVec<long>.fStore + iVar4,8,
          (long)this->fNumHeaders - 1,(FILE *)this->fIOStream);
    __n = (long)this->fNumHeaders - 1;
    iVar4 = iVar4 + (int)__n;
    fread(&nextpos,8,__n,(FILE *)this->fIOStream);
    fseek((FILE *)this->fIOStream,nextpos,0);
    uVar2 = uVar2 + 1;
    iVar5 = iVar5 + -1;
    iVar3 = iVar3 + 100;
  }
  return;
}

Assistant:

void TPZFileEqnStorage<TVar>::ReadBlockPositions()
{
#ifdef PZ_LOG
	if(logger.isDebugEnabled() ) LOGPZ_DEBUG(logger,"Reading block positions")
#endif
	int aux = fNumBlocks * (fNumHeaders-1);
	fBlockPos.Resize(aux);
	int i, ibl = 0;
	cout << "Reading Block Positions\n";
	cout.flush();
	int64_t sizereturn;
	sizereturn = 0;
	for(i=0;i<fNumBlocks;i++) {
		cout << "*";
		cout.flush();
		if(!(i%20)){
			cout << 100*i/fNumBlocks << "% Read\n";
			cout.flush();
		}
		sizereturn = fread(&fBlockPos[ibl],sizeof(int64_t),fNumHeaders-1,fIOStream);
#ifdef PZDEBUG
		if (sizereturn != fNumHeaders-1) DebugStop();
#endif
		ibl+=fNumHeaders-1;
		int64_t nextpos;
		sizereturn = fread(&nextpos,sizeof(int64_t),fNumHeaders-1,fIOStream);
#ifdef PZDEBUG
		if (sizereturn != fNumHeaders-1) DebugStop();
#endif
		fseek(fIOStream,nextpos,SEEK_SET);
	}
}